

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNSISGenerator.cxx
# Opt level: O0

string * cmCPackNSISGenerator::TranslateNewlines(string *__return_storage_ptr__,string *str)

{
  string *str_local;
  
  cmsys::SystemTools::ReplaceString(str,"\n","$\\r$\\n");
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackNSISGenerator::TranslateNewlines(std::string str)
{
  cmSystemTools::ReplaceString(str, "\n", "$\\r$\\n");
  return str;
}